

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O3

void If_LibBoxAdd(If_LibBox_t *p,If_Box_t *pBox)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  uint uVar5;
  size_t __size;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  
  uVar5 = pBox->Id;
  pVVar8 = p->vBoxes;
  iVar2 = pVVar8->nSize;
  if ((int)uVar5 < iVar2) goto LAB_0042a6de;
  lVar4 = (long)(int)uVar5 * 2 + 10;
  iVar6 = (int)lVar4;
  if (iVar6 <= iVar2) goto LAB_0042a6de;
  iVar1 = pVVar8->nCap;
  iVar7 = iVar1 * 2;
  if (iVar7 < iVar6) {
    if (iVar1 < iVar6) {
      __size = lVar4 * 8;
      if (pVVar8->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar8->pArray,__size);
      }
      pVVar8->pArray = ppvVar3;
      iVar7 = iVar6;
LAB_0042a6ad:
      pVVar8->nCap = iVar7;
      iVar2 = pVVar8->nSize;
    }
  }
  else if (iVar1 < iVar6) {
    if (pVVar8->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc((long)iVar1 << 4);
    }
    else {
      ppvVar3 = (void **)realloc(pVVar8->pArray,(long)iVar1 << 4);
    }
    pVVar8->pArray = ppvVar3;
    goto LAB_0042a6ad;
  }
  if (iVar2 < iVar6) {
    lVar4 = (long)iVar2;
    do {
      pVVar8->pArray[lVar4] = (void *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar6 != lVar4);
  }
  pVVar8->nSize = iVar6;
  pVVar8 = p->vBoxes;
  uVar5 = pBox->Id;
LAB_0042a6de:
  if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar8->nSize)) {
    if (pVVar8->pArray[uVar5] == (void *)0x0) {
      pVVar8->pArray[uVar5] = pBox;
      p->nBoxes = p->nBoxes + 1;
      return;
    }
    __assert_fail("Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibBox.c"
                  ,0x8c,"void If_LibBoxAdd(If_LibBox_t *, If_Box_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void If_LibBoxAdd( If_LibBox_t * p, If_Box_t * pBox )
{
    if ( pBox->Id >= Vec_PtrSize(p->vBoxes) )
        Vec_PtrFillExtra( p->vBoxes, 2 * pBox->Id + 10, NULL );
    assert( Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL );
    Vec_PtrWriteEntry( p->vBoxes, pBox->Id, pBox );
    p->nBoxes++;
}